

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEra2.c
# Opt level: O0

Vec_Vec_t * Gia_ManDeriveCiTfo(Gia_Man_t *p)

{
  int iVar1;
  Vec_Ptr_t *p_00;
  Vec_Int_t *Entry;
  bool bVar2;
  int local_24;
  Gia_Obj_t *pGStack_20;
  int i;
  Gia_Obj_t *pPivot;
  Vec_Ptr_t *vRes;
  Gia_Man_t *p_local;
  
  Gia_ManCleanMark0(p);
  Gia_ManIncrementTravId(p);
  iVar1 = Gia_ManCiNum(p);
  p_00 = Vec_PtrAlloc(iVar1);
  local_24 = 0;
  while( true ) {
    iVar1 = Vec_IntSize(p->vCis);
    bVar2 = false;
    if (local_24 < iVar1) {
      pGStack_20 = Gia_ManCi(p,local_24);
      bVar2 = pGStack_20 != (Gia_Obj_t *)0x0;
    }
    if (!bVar2) break;
    Entry = Gia_ManDeriveCiTfoOne(p,pGStack_20);
    Vec_PtrPush(p_00,Entry);
    local_24 = local_24 + 1;
  }
  Gia_ManCleanMark0(p);
  return (Vec_Vec_t *)p_00;
}

Assistant:

Vec_Vec_t * Gia_ManDeriveCiTfo( Gia_Man_t * p )
{
    Vec_Ptr_t * vRes;
    Gia_Obj_t * pPivot;
    int i;
    Gia_ManCleanMark0( p );
    Gia_ManIncrementTravId( p );
    vRes = Vec_PtrAlloc( Gia_ManCiNum(p) );
    Gia_ManForEachCi( p, pPivot, i )
        Vec_PtrPush( vRes, Gia_ManDeriveCiTfoOne(p, pPivot) );
    Gia_ManCleanMark0( p );
    return (Vec_Vec_t *)vRes;
}